

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase988::run(TestCase988 *this)

{
  long lVar1;
  size_t in_R8;
  Orphanage OVar2;
  Reader data;
  byte b;
  Builder root;
  anon_union_56_2_d657db04 anon_var_0;
  MallocMessageBuilder builder;
  OrphanBuilder local_1c8;
  OrphanBuilder local_1a8;
  StructBuilder local_180;
  undefined1 local_158 [56];
  MallocMessageBuilder local_120;
  
  local_158._32_8_ = (Maybe<kj::Own<capnp::ClientHook>_> *)0x5555555555555555;
  local_158._40_8_ = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x5555555555555555;
  local_158._16_8_ = 0x5555555555555555;
  local_158._24_8_ = (_func_int **)0x5555555555555555;
  local_158._0_8_ = (_func_int **)0x5555555555555555;
  local_158._8_8_ = (MessageBuilder *)0x5555555555555555;
  local_158._48_2_ = 0x5555;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)(local_158 + 0x38),0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1c8,(MessageBuilder *)(local_158 + 0x38));
  local_1a8.capTable = local_1c8.capTable;
  local_1a8.tag.content = local_1c8.tag.content;
  local_1a8.segment = local_1c8.segment;
  PointerBuilder::getStruct
            (&local_180,(PointerBuilder *)&local_1a8,(StructSize)0x140006,(word *)0x0);
  OVar2 = MessageBuilder::getOrphanage((MessageBuilder *)(local_158 + 0x38));
  data.super_ArrayPtr<const_unsigned_char>.size_ = in_R8;
  data.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)0x32;
  OrphanBuilder::referenceExternalData
            (&local_1a8,(OrphanBuilder *)OVar2.arena,(BuilderArena *)local_158,data);
  local_1c8.capTable = local_1a8.capTable;
  local_1c8.location = local_1a8.location;
  local_1c8.tag.content = local_1a8.tag.content;
  local_1c8.segment = local_1a8.segment;
  local_1a8.capTable = (CapTableBuilder *)(local_180.pointers + 1);
  local_1a8.tag.content = (uint64_t)local_180.segment;
  local_1a8.segment = (SegmentBuilder *)local_180.capTable;
  PointerBuilder::adopt((PointerBuilder *)&local_1a8,&local_1c8);
  if (local_1c8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_1c8);
  }
  local_1a8.capTable = (CapTableBuilder *)(local_180.pointers + 1);
  local_1a8.tag.content = (uint64_t)local_180.segment;
  local_1a8.segment = (SegmentBuilder *)local_180.capTable;
  PointerBuilder::setBlob<capnp::Data>((PointerBuilder *)&local_1a8,(Reader)ZEXT816(0));
  lVar1 = 0;
  do {
    local_1c8.tag.content._0_1_ = local_158[lVar1];
    if ((local_158[lVar1] != 'U') && (kj::_::Debug::minSeverity < 3)) {
      local_1a8.tag.content._0_4_ = 0x55;
      kj::_::Debug::log<char_const(&)[31],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x3ee,ERROR,"\"failed: expected \" \"(0x55) == (b)\", 0x55, b",
                 (char (*) [31])"failed: expected (0x55) == (b)",(int *)&local_1a8,
                 (uchar *)&local_1c8);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x32);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)(local_158 + 0x38));
  return;
}

Assistant:

TEST(Orphans, ReferenceExternalData_NoZeroOnSet) {
  // Verify that an external blob is not zeroed by setFoo().

  union {
    word align;
    byte data[50];
  };

  memset(data, 0x55, sizeof(data));

  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestAllTypes>();
  root.adoptDataField(builder.getOrphanage().referenceExternalData(
      Data::Builder(data, sizeof(data))));

  root.setDataField(Data::Builder());

  for (byte b: data) {
    EXPECT_EQ(0x55, b);
  }
}